

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroup.cxx
# Opt level: O0

cmSourceGroup * __thiscall cmSourceGroup::MatchChildrenRegex(cmSourceGroup *this,char *name)

{
  bool bVar1;
  pointer this_00;
  cmSourceGroup *pcVar2;
  cmSourceGroup *result;
  iterator end;
  iterator iter;
  char *name_local;
  cmSourceGroup *this_local;
  
  end = std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::begin
                  (&this->Internal->GroupChildren);
  result = (cmSourceGroup *)
           std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::end
                     (&this->Internal->GroupChildren);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&end,(__normal_iterator<cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
                             *)&result);
    if (!bVar1) {
      bVar1 = MatchesRegex(this,name);
      this_local = this;
      if (!bVar1) {
        this_local = (cmSourceGroup *)0x0;
      }
      return this_local;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
              ::operator->(&end);
    pcVar2 = MatchChildrenRegex(this_00,name);
    if (pcVar2 != (cmSourceGroup *)0x0) break;
    __gnu_cxx::
    __normal_iterator<cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
    ::operator++(&end);
  }
  return pcVar2;
}

Assistant:

cmSourceGroup* cmSourceGroup::MatchChildrenRegex(const char* name)
{
  // initializing iterators
  std::vector<cmSourceGroup>::iterator iter =
    this->Internal->GroupChildren.begin();
  std::vector<cmSourceGroup>::iterator end =
    this->Internal->GroupChildren.end();

  for (; iter != end; ++iter) {
    cmSourceGroup* result = iter->MatchChildrenRegex(name);
    if (result) {
      return result;
    }
  }
  if (this->MatchesRegex(name)) {
    return this;
  }

  return CM_NULLPTR;
}